

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

int ssw2mcpl_app(int argc,char **argv)

{
  int iVar1;
  undefined8 in_RSI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  int ok;
  int do_gzip;
  int surface_info;
  int double_prec;
  char *cfgfile;
  char *outfile;
  char *infile;
  char *in_stack_000000a8;
  int in_stack_000000b4;
  int in_stack_000000b8;
  int in_stack_000000bc;
  char *in_stack_000000c0;
  char *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char **in_stack_ffffffffffffffd0;
  char **in_stack_ffffffffffffffd8;
  char **in_stack_ffffffffffffffe0;
  char **in_stack_ffffffffffffffe8;
  
  ssw2mcpl_parse_args((int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8,
                      in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                      (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      unaff_retaddr,in_stack_00000008);
  iVar1 = ssw2mcpl2(in_stack_000000c8,in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,
                    in_stack_000000b4,in_stack_000000a8);
  return (uint)(iVar1 == 0);
}

Assistant:

int ssw2mcpl_app(int argc,char** argv)
{
  const char * infile;
  const char * outfile;
  const char * cfgfile;
  int double_prec, surface_info, do_gzip;
  ssw2mcpl_parse_args(argc,argv,&infile,&outfile,&cfgfile,&double_prec,&surface_info,&do_gzip);
  int ok = ssw2mcpl2(infile, outfile,double_prec, surface_info, do_gzip,cfgfile);
  return ok ? 0 : 1;
}